

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# surface_mesh.cpp
# Opt level: O0

string * __thiscall polyscope::SurfaceMesh::getMaterial_abi_cxx11_(SurfaceMesh *this)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar1;
  long in_RSI;
  string *in_RDI;
  
  pbVar1 = PersistentValue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           ::get((PersistentValue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)(in_RSI + 0x1578));
  std::__cxx11::string::string((string *)in_RDI,(string *)pbVar1);
  return in_RDI;
}

Assistant:

std::string SurfaceMesh::getMaterial() { return material.get(); }